

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex_float.h
# Opt level: O1

ostream * spvtools::utils::operator<<
                    (ostream *os,
                    HexFloat<spvtools::utils::FloatProxy<spvtools::utils::Float16>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<spvtools::utils::Float16>_>_>
                    *value)

{
  ostream *poVar1;
  ushort uVar2;
  long lVar3;
  uint uVar4;
  ostream oVar5;
  ostream oVar6;
  short sVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  short sVar11;
  char *pcVar12;
  ushort uVar13;
  ushort uVar14;
  ushort uVar15;
  byte local_45;
  undefined4 local_44;
  char *local_40;
  ulong local_38;
  
  uVar2 = (value->value_).data_;
  uVar10 = (uint)uVar2;
  pcVar12 = "-";
  if (-1 < (short)uVar2) {
    pcVar12 = "";
  }
  uVar13 = uVar2 >> 10 & 0x1f;
  uVar8 = (uint)uVar2 * 4 & 0xffc;
  sVar7 = (short)uVar8;
  sVar11 = 0;
  if (uVar13 != 0 || sVar7 != 0) {
    sVar11 = uVar13 - 0xf;
  }
  if ((uVar13 != 0 || sVar7 != 0) && (uVar2 >> 10 & 0x1f) == 0) {
    uVar9 = uVar8;
    if ((uVar2 >> 9 & 1) == 0) {
      do {
        uVar8 = uVar9 * 2;
        sVar11 = sVar11 + -1;
        uVar4 = uVar9 >> 10;
        uVar9 = uVar8;
      } while ((uVar4 & 1) == 0);
    }
    uVar8 = uVar8 * 2 & 0xff8;
  }
  uVar15 = 3;
  if ((uVar8 & 0xc) == 0) {
    uVar14 = 3;
    do {
      uVar15 = uVar14 - 1;
      if (uVar14 == 1) break;
      uVar9 = uVar8 & 0xf0;
      uVar8 = uVar8 >> 4;
      uVar14 = uVar15;
    } while (uVar9 == 0);
  }
  lVar3 = *(long *)(*(long *)os + -0x18);
  poVar1 = os + lVar3;
  local_44 = *(undefined4 *)(os + lVar3 + 0x18);
  if (os[lVar3 + 0xe1] == (ostream)0x0) {
    local_40 = pcVar12;
    local_38 = (ulong)uVar2;
    oVar5 = (ostream)std::ios::widen((char)poVar1);
    uVar10 = (uint)local_38;
    poVar1[0xe0] = oVar5;
    poVar1[0xe1] = (ostream)0x1;
    pcVar12 = local_40;
  }
  oVar5 = poVar1[0xe0];
  std::__ostream_insert<char,std::char_traits<char>>(os,pcVar12,(ulong)(uVar10 >> 0xf));
  std::__ostream_insert<char,std::char_traits<char>>(os,"0x",2);
  local_45 = (uVar13 != 0 || sVar7 != 0) | 0x30;
  std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&local_45,1);
  if (uVar15 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(os,".",1);
    lVar3 = *(long *)os;
    *(ulong *)(os + *(long *)(lVar3 + -0x18) + 0x10) = (ulong)uVar15;
    lVar3 = *(long *)(lVar3 + -0x18);
    poVar1 = os + lVar3;
    if (os[lVar3 + 0xe1] == (ostream)0x0) {
      oVar6 = (ostream)std::ios::widen((char)poVar1);
      poVar1[0xe0] = oVar6;
      poVar1[0xe1] = (ostream)0x1;
    }
    poVar1[0xe0] = (ostream)0x30;
    *(uint *)(os + *(long *)(*(long *)os + -0x18) + 0x18) =
         *(uint *)(os + *(long *)(*(long *)os + -0x18) + 0x18) & 0xffffffb5 | 8;
    std::ostream::_M_insert<unsigned_long>((ulong)os);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"p",1);
  *(uint *)(os + *(long *)(*(long *)os + -0x18) + 0x18) =
       *(uint *)(os + *(long *)(*(long *)os + -0x18) + 0x18) & 0xffffffb5 | 2;
  pcVar12 = "";
  if (-1 < sVar11) {
    pcVar12 = "+";
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,pcVar12,(ulong)(-1 < sVar11));
  std::ostream::operator<<(os,sVar11);
  lVar3 = *(long *)os;
  *(undefined4 *)(os + *(long *)(lVar3 + -0x18) + 0x18) = local_44;
  lVar3 = *(long *)(lVar3 + -0x18);
  poVar1 = os + lVar3;
  if (os[lVar3 + 0xe1] == (ostream)0x0) {
    oVar6 = (ostream)std::ios::widen((char)poVar1);
    poVar1[0xe0] = oVar6;
    poVar1[0xe1] = (ostream)0x1;
  }
  poVar1[0xe0] = oVar5;
  return os;
}

Assistant:

T value() const { return value_; }